

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O3

void __thiscall
gimage::Polygon::getVEdges
          (Polygon *this,vector<gimage::VEdge,_std::allocator<gimage::VEdge>_> *list)

{
  ulong uVar1;
  VEdge *pVVar2;
  iterator __position;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  VEdge *pVVar9;
  long lVar10;
  ulong uVar11;
  __normal_iterator<gimage::VEdge_*,_std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>_>
  __i;
  __normal_iterator<gimage::VEdge_*,_std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>_>
  __first;
  VEdge *pVVar12;
  pointer pSVar13;
  __normal_iterator<gimage::VEdge_*,_std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>_>
  _Var14;
  __normal_iterator<gimage::VEdge_*,_std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>_>
  _Var15;
  ulong uVar16;
  long lVar17;
  __normal_iterator<gimage::VEdge_*,_std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>_>
  __last;
  size_t __n;
  VEdge v;
  VEdge local_58;
  
  __first._M_current = *(VEdge **)list;
  __last._M_current = *(VEdge **)(list + 8);
  if (*(VEdge **)(list + 8) != __first._M_current) {
    *(VEdge **)(list + 8) = __first._M_current;
    __last._M_current = __first._M_current;
  }
  pSVar13 = (this->vertex).
            super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(this->vertex).
                 super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar13;
  if (lVar10 != 0) {
    lVar17 = 8;
    uVar11 = (lVar10 >> 4) - 1;
    uVar16 = 0;
    do {
      VEdge::VEdge(&local_58,*(long *)((long)pSVar13->v + lVar17 + -8),
                   *(long *)((long)pSVar13->v + lVar17),pSVar13[uVar11].v[0],pSVar13[uVar11].v[1]);
      if (local_58.ymin < local_58.ymax) {
        __position._M_current = *(VEdge **)(list + 8);
        if (__position._M_current == *(VEdge **)(list + 0x10)) {
          std::vector<gimage::VEdge,std::allocator<gimage::VEdge>>::
          _M_realloc_insert<gimage::VEdge_const&>
                    ((vector<gimage::VEdge,std::allocator<gimage::VEdge>> *)list,__position,
                     &local_58);
        }
        else {
          (__position._M_current)->xc = local_58.xc;
          (__position._M_current)->xstart = local_58.xstart;
          (__position._M_current)->xend = local_58.xend;
          (__position._M_current)->ymin = local_58.ymin;
          (__position._M_current)->ymax = local_58.ymax;
          *(long *)(list + 8) = *(long *)(list + 8) + 0x28;
        }
      }
      uVar1 = uVar16 + 1;
      pSVar13 = (this->vertex).
                super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x10;
      uVar11 = uVar16;
      uVar16 = uVar1;
    } while (uVar1 < (ulong)((long)(this->vertex).
                                   super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar13 >> 4))
    ;
    __first._M_current = *(VEdge **)list;
    __last._M_current = *(VEdge **)(list + 8);
  }
  if (__first._M_current != __last._M_current) {
    uVar11 = ((long)__last._M_current - (long)__first._M_current >> 3) * -0x3333333333333333;
    lVar10 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<gimage::VEdge*,std::vector<gimage::VEdge,std::allocator<gimage::VEdge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(gimage::VEdge_const&,gimage::VEdge_const&)>>
              (__first,__last,(ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_gimage::VEdge_&,_const_gimage::VEdge_&)>)compareY);
    _Var15._M_current = __first._M_current;
    if ((long)__last._M_current - (long)__first._M_current < 0x281) {
      while (pVVar12 = _Var15._M_current + 1, pVVar12 != __last._M_current) {
        lVar10 = _Var15._M_current[1].ymin;
        if (lVar10 < (__first._M_current)->ymin) {
          local_58.xc = pVVar12->xc;
          local_58.ymin = pVVar12->ymin;
          local_58.ymax = pVVar12->ymax;
          local_58.xstart = pVVar12->xstart;
          local_58.xend = pVVar12->xend;
          memmove((void *)((long)_Var15._M_current +
                          (0x50 - ((long)pVVar12 - (long)__first._M_current))),__first._M_current,
                  (long)pVVar12 - (long)__first._M_current);
          (__first._M_current)->ymin = local_58.ymin;
          (__first._M_current)->ymax = local_58.ymax;
          (__first._M_current)->xstart = local_58.xstart;
          (__first._M_current)->xend = local_58.xend;
          (__first._M_current)->xc = local_58.xc;
          _Var15._M_current = pVVar12;
        }
        else {
          lVar3 = pVVar12->ymax;
          lVar4 = pVVar12->xstart;
          lVar5 = pVVar12->xend;
          lVar6 = pVVar12->xc;
          lVar17 = (_Var15._M_current)->ymin;
          pVVar2 = pVVar12;
          while (lVar10 < lVar17) {
            pVVar2->xc = pVVar2[-1].xc;
            lVar17 = pVVar2[-1].ymin;
            lVar7 = pVVar2[-1].ymax;
            lVar8 = pVVar2[-1].xend;
            pVVar2->xstart = pVVar2[-1].xstart;
            pVVar2->xend = lVar8;
            pVVar2->ymin = lVar17;
            pVVar2->ymax = lVar7;
            lVar17 = pVVar2[-2].ymin;
            pVVar2 = pVVar2 + -1;
          }
          pVVar2->ymin = lVar10;
          pVVar2->ymax = lVar3;
          pVVar2->xstart = lVar4;
          pVVar2->xend = lVar5;
          pVVar2->xc = lVar6;
          _Var15._M_current = pVVar12;
        }
      }
    }
    else {
      __n = 0x28;
      _Var14._M_current = __first._M_current;
      do {
        _Var15._M_current = _Var15._M_current + 1;
        pVVar12 = (VEdge *)((long)&(__first._M_current)->ymin + __n);
        lVar10 = *(long *)((long)&(__first._M_current)->ymin + __n);
        if (lVar10 < (__first._M_current)->ymin) {
          local_58.xc = pVVar12->xc;
          local_58.ymin = pVVar12->ymin;
          local_58.ymax = pVVar12->ymax;
          local_58.xstart = pVVar12->xstart;
          local_58.xend = pVVar12->xend;
          memmove((void *)((long)_Var14._M_current + (0x50 - __n)),__first._M_current,__n);
          (__first._M_current)->ymin = local_58.ymin;
          (__first._M_current)->ymax = local_58.ymax;
          (__first._M_current)->xstart = local_58.xstart;
          (__first._M_current)->xend = local_58.xend;
          (__first._M_current)->xc = local_58.xc;
        }
        else {
          lVar3 = pVVar12->ymax;
          lVar4 = pVVar12->xstart;
          lVar5 = pVVar12->xend;
          lVar6 = pVVar12->xc;
          lVar17 = (_Var14._M_current)->ymin;
          pVVar2 = pVVar12;
          pVVar9 = _Var15._M_current;
          while (lVar10 < lVar17) {
            pVVar2 = pVVar9 + -1;
            pVVar9->xc = pVVar9[-1].xc;
            lVar17 = pVVar9[-1].ymin;
            lVar7 = pVVar9[-1].ymax;
            lVar8 = pVVar9[-1].xend;
            pVVar9->xstart = pVVar9[-1].xstart;
            pVVar9->xend = lVar8;
            pVVar9->ymin = lVar17;
            pVVar9->ymax = lVar7;
            lVar17 = pVVar9[-2].ymin;
            pVVar9 = pVVar2;
          }
          pVVar2->ymin = lVar10;
          pVVar2->ymax = lVar3;
          pVVar2->xstart = lVar4;
          pVVar2->xend = lVar5;
          pVVar2->xc = lVar6;
        }
        __n = __n + 0x28;
        _Var14._M_current = pVVar12;
      } while (__n != 0x280);
      for (pVVar12 = __first._M_current + 0x10; pVVar12 != __last._M_current; pVVar12 = pVVar12 + 1)
      {
        lVar10 = pVVar12->ymin;
        lVar3 = pVVar12->xend;
        lVar4 = pVVar12->xc;
        lVar5 = pVVar12->ymax;
        lVar6 = pVVar12->xstart;
        lVar17 = pVVar12[-1].ymin;
        pVVar2 = pVVar12;
        while (lVar10 < lVar17) {
          pVVar2->xc = pVVar2[-1].xc;
          lVar17 = pVVar2[-1].ymin;
          lVar7 = pVVar2[-1].ymax;
          lVar8 = pVVar2[-1].xend;
          pVVar2->xstart = pVVar2[-1].xstart;
          pVVar2->xend = lVar8;
          pVVar2->ymin = lVar17;
          pVVar2->ymax = lVar7;
          lVar17 = pVVar2[-2].ymin;
          pVVar2 = pVVar2 + -1;
        }
        pVVar2->ymin = lVar10;
        pVVar2->ymax = lVar5;
        pVVar2->xstart = lVar6;
        pVVar2->xend = lVar3;
        pVVar2->xc = lVar4;
      }
    }
  }
  return;
}

Assistant:

void Polygon::getVEdges(std::vector<VEdge> &list) const
{
  list.clear();

  size_t j=vertex.size()-1;
  for (size_t i=0; i<vertex.size(); i++)
  {
    VEdge v(vertex[i][0], vertex[i][1], vertex[j][0], vertex[j][1]);

    if (v.isValid())
    {
      list.push_back(v);
    }

    j=i;
  }

  std::sort(list.begin(), list.end(), compareY);
}